

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

void bmGateWay(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int p_equivalence)

{
  size_t sVar1;
  size_t __size;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  bool bVar5;
  bool bVar6;
  int *iGroup1;
  int *oGroup1;
  Vec_Int_t **oMatch;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Vec_Int_t **oDep;
  Vec_Int_t **ppVVar11;
  Vec_Int_t **ppVVar12;
  char *vPiValues;
  Vec_Int_t **vPiValues_00;
  int *piVar13;
  Vec_Int_t *pVVar14;
  int *piVar15;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t **ppVVar16;
  long lVar17;
  Vec_Int_t **ppVVar18;
  long lVar19;
  char *pNtk_01;
  ulong uVar20;
  size_t __size_00;
  size_t sVar21;
  ulong uVar22;
  float fVar23;
  Vec_Int_t **in_stack_fffffffffffffe90;
  int *in_stack_fffffffffffffea0;
  int *piVar24;
  int iLastItem1;
  int oLastItem1;
  int oLastItem2;
  Abc_Ntk_t *local_f8;
  int iLastItem2;
  Vec_Int_t **local_e8;
  Vec_Int_t **local_e0;
  Vec_Ptr_t **local_d8;
  Vec_Int_t **local_d0;
  Vec_Ptr_t **local_c8;
  Vec_Int_t **local_c0;
  int *local_b8;
  int *local_b0;
  Vec_Int_t **local_a8;
  Vec_Int_t **local_a0;
  long local_98;
  long local_90;
  Abc_Ntk_t *local_88;
  int *local_80;
  int *local_78;
  int *local_70;
  Vec_Int_t **local_68;
  timespec ts;
  
  iVar8 = clock_gettime(3,(timespec *)&ts);
  if (iVar8 < 0) {
    local_98 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_98 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  uVar2 = pNtk1->vPis->nSize;
  local_90 = (long)(int)uVar2;
  local_e0 = (Vec_Int_t **)(ulong)uVar2;
  sVar1 = (long)local_e0 * 8;
  local_c8 = (Vec_Ptr_t **)(ulong)(uint)p_equivalence;
  local_a0 = (Vec_Int_t **)malloc(sVar1);
  uVar2 = pNtk1->vPos->nSize;
  local_d8 = (Vec_Ptr_t **)(ulong)uVar2;
  sVar21 = (long)local_d8 * 8;
  local_88 = pNtk1;
  local_c0 = (Vec_Int_t **)malloc(sVar21);
  uVar3 = pNtk2->vPis->nSize;
  local_e8 = (Vec_Int_t **)(ulong)uVar3;
  local_80 = (int *)(long)(int)uVar3;
  __size = (long)local_e8 * 8;
  local_d0 = (Vec_Int_t **)malloc(__size);
  uVar3 = pNtk2->vPos->nSize;
  __size_00 = (ulong)uVar3 << 3;
  local_f8 = pNtk2;
  oDep = (Vec_Int_t **)malloc(__size_00);
  ppVVar11 = (Vec_Int_t **)malloc(sVar1);
  local_68 = (Vec_Int_t **)malloc(sVar21);
  ppVVar12 = (Vec_Int_t **)malloc(__size);
  local_a8 = (Vec_Int_t **)malloc(__size_00);
  lVar17 = local_90;
  local_78 = (int *)malloc(local_90 * 4);
  local_70 = (int *)malloc((long)(int)uVar2 << 2);
  piVar13 = local_80;
  local_b8 = (int *)malloc((long)local_80 * 4);
  local_b0 = (int *)malloc((long)(int)uVar3 << 2);
  vPiValues = (char *)malloc(lVar17 + 1);
  vPiValues[lVar17] = '\0';
  vPiValues_00 = (Vec_Int_t **)malloc((long)piVar13 + 1);
  ppVVar18 = local_e0;
  *(char *)((long)vPiValues_00 + (long)piVar13) = '\0';
  sVar1 = (long)local_e0 * 4;
  piVar13 = (int *)malloc(sVar1);
  local_80 = (int *)malloc((long)local_e8 << 2);
  if (0 < lVar17) {
    memset(vPiValues,0x30,(size_t)ppVVar18);
    memset(vPiValues_00,0x30,(size_t)ppVVar18);
    sVar21 = 0;
    memset(piVar13,0,sVar1);
    memset(local_80,0,sVar1);
    do {
      pVVar14 = (Vec_Int_t *)malloc(0x10);
      pVVar14->nCap = 0x10;
      pVVar14->nSize = 0;
      piVar15 = (int *)malloc(0x40);
      pVVar14->pArray = piVar15;
      local_a0[sVar21] = pVVar14;
      pVVar14 = (Vec_Int_t *)malloc(0x10);
      pVVar14->nCap = 0x10;
      pVVar14->nSize = 0;
      piVar15 = (int *)malloc(0x40);
      pVVar14->pArray = piVar15;
      ppVVar11[sVar21] = pVVar14;
      pVVar14 = (Vec_Int_t *)malloc(0x10);
      pVVar14->nCap = 0x10;
      pVVar14->nSize = 0;
      piVar15 = (int *)malloc(0x40);
      pVVar14->pArray = piVar15;
      local_d0[sVar21] = pVVar14;
      pVVar14 = (Vec_Int_t *)malloc(0x10);
      pVVar14->nCap = 0x10;
      pVVar14->nSize = 0;
      piVar15 = (int *)malloc(0x40);
      pVVar14->pArray = piVar15;
      ppVVar12[sVar21] = pVVar14;
      sVar21 = sVar21 + 1;
    } while (ppVVar18 != (Vec_Int_t **)sVar21);
  }
  oMatch = local_68;
  ppVVar18 = local_c0;
  local_e8 = ppVVar12;
  local_e0 = ppVVar11;
  if (0 < (int)local_d8) {
    uVar22 = 0;
    do {
      pVVar14 = (Vec_Int_t *)malloc(0x10);
      pVVar14->nCap = 0x10;
      pVVar14->nSize = 0;
      piVar15 = (int *)malloc(0x40);
      pVVar14->pArray = piVar15;
      ppVVar18[uVar22] = pVVar14;
      pVVar14 = (Vec_Int_t *)malloc(0x10);
      pVVar14->nCap = 0x10;
      pVVar14->nSize = 0;
      piVar15 = (int *)malloc(0x40);
      pVVar14->pArray = piVar15;
      oMatch[uVar22] = pVVar14;
      pVVar14 = (Vec_Int_t *)malloc(0x10);
      pVVar14->nCap = 0x10;
      pVVar14->nSize = 0;
      piVar15 = (int *)malloc(0x40);
      pVVar14->pArray = piVar15;
      oDep[uVar22] = pVVar14;
      pVVar14 = (Vec_Int_t *)malloc(0x10);
      pVVar14->nCap = 0x10;
      pVVar14->nSize = 0;
      piVar15 = (int *)malloc(0x40);
      pVVar14->pArray = piVar15;
      local_a8[uVar22] = pVVar14;
      uVar22 = uVar22 + 1;
    } while (local_d8 != (Vec_Ptr_t **)uVar22);
  }
  pNtk = Abc_NtkStrash(local_88,0,0,0);
  pNtk_00 = Abc_NtkStrash(local_f8,0,0,0);
  puts("Network  strashing is done!");
  ppVVar11 = local_a0;
  getDependencies(pNtk,local_a0,ppVVar18);
  getDependencies(pNtk_00,local_d0,oDep);
  puts("Getting dependencies is done!");
  iVar8 = (int)local_c8;
  initMatchList(pNtk,ppVVar11,ppVVar18,local_e0,&iLastItem1,oMatch,&oLastItem1,local_78,local_70,
                iVar8);
  local_f8 = pNtk_00;
  initMatchList(pNtk_00,local_d0,oDep,local_e8,&iLastItem2,local_a8,&oLastItem2,local_b8,local_b0,
                iVar8);
  puts("Initializing match lists is done!");
  if ((iLastItem1 == iLastItem2) && (oLastItem1 == oLastItem2)) {
    pNtk_01 = "Refining IOs by dependencies ...";
    printf("Refining IOs by dependencies ...");
    iVar8 = 1;
    iVar9 = 1;
    do {
      piVar15 = local_70;
      if (iVar9 != 0) {
        iSortDependencies(pNtk,local_a0,local_70);
        pNtk_01 = (char *)local_f8;
        iSortDependencies(local_f8,local_d0,local_b0);
      }
      piVar24 = local_78;
      ppVVar18 = local_c0;
      if (iVar8 != 0) {
        oSortDependencies(pNtk,local_c0,local_78);
        pNtk_01 = (char *)local_f8;
        oSortDependencies(local_f8,oDep,local_b8);
      }
      if ((iLastItem1 < pNtk->vPis->nSize) &&
         (iSplitByDep((Abc_Ntk_t *)pNtk_01,local_a0,local_e0,piVar24,&iLastItem1,piVar15),
         oLastItem1 < pNtk->vPos->nSize)) {
        oSplitByDep((Abc_Ntk_t *)pNtk_01,ppVVar18,local_68,piVar15,&oLastItem1,piVar24);
      }
      iVar9 = 0;
      iVar8 = 0;
      if (iLastItem2 < local_f8->vPis->nSize) {
        iVar8 = iSplitByDep((Abc_Ntk_t *)pNtk_01,local_d0,local_e8,local_b8,&iLastItem2,local_b0);
      }
      if (oLastItem2 < local_f8->vPos->nSize) {
        iVar9 = oSplitByDep((Abc_Ntk_t *)pNtk_01,oDep,local_a8,local_b0,&oLastItem2,local_b8);
      }
      bVar5 = oLastItem1 != oLastItem2;
      bVar6 = iLastItem1 != iLastItem2;
      if (bVar5 || bVar6) {
        fwrite("I/O dependencies of two circuits are different.\n",0x30,1,_stdout);
        break;
      }
    } while (iVar8 != 0 || iVar9 != 0);
    if (!bVar5 && !bVar6) {
      puts(" done!");
      iVar8 = clock_gettime(3,(timespec *)&ts);
      if (iVar8 < 0) {
        lVar17 = -1;
      }
      else {
        lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      local_90._0_4_ = (float)(lVar17 + local_98);
      iVar8 = clock_gettime(3,(timespec *)&ts);
      if (iVar8 < 0) {
        local_98 = 1;
      }
      else {
        lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
        local_98 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + ts.tv_sec * -1000000;
      }
      local_90 = CONCAT44(local_90._4_4_,(float)local_90 / 1e+06);
      ppVVar16 = findTopologicalOrder(pNtk);
      local_c8 = findTopologicalOrder(local_f8);
      printf("Refining IOs by simulation ...");
      iVar8 = 0;
      local_d8 = ppVVar16;
      do {
        local_88 = (Abc_Ntk_t *)CONCAT44(local_88._4_4_,iVar8);
        lVar17 = (long)iLastItem1;
        if (0 < lVar17) {
          lVar19 = 0;
          do {
            ppVVar18 = local_e0;
            rand();
            rand();
            iVar8 = rand();
            uVar2 = ppVVar18[lVar19]->nSize;
            pVVar14 = local_e8[lVar19];
            uVar3 = pVVar14->nSize;
            if (uVar2 == uVar3) {
              if (0 < (int)uVar2) {
                bVar7 = (byte)iVar8 & 1 | 0x30;
                piVar15 = ppVVar18[lVar19]->pArray;
                uVar22 = 0;
                if (0 < (int)uVar3) {
                  uVar22 = (ulong)uVar3;
                }
                uVar20 = 0;
                do {
                  vPiValues[piVar15[uVar20]] = bVar7;
                  if (uVar22 == uVar20) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  *(byte *)((long)vPiValues_00 + (long)pVVar14->pArray[uVar20]) = bVar7;
                  uVar20 = uVar20 + 1;
                } while (uVar2 != uVar20);
              }
            }
            else {
              fwrite("Input refinement by simulation finds two circuits different.\n",0x3d,1,_stdout
                    );
            }
            ppVVar18 = local_c0;
            if (uVar2 != uVar3) goto LAB_00247ac7;
            lVar19 = lVar19 + 1;
          } while (lVar19 != lVar17);
        }
        ppVVar18 = local_c0;
        iVar9 = refineIOBySimulation
                          (pNtk,local_e0,&iLastItem1,local_78,local_a0,local_68,&oLastItem1,local_70
                           ,local_c0,vPiValues,piVar13,local_d8);
        piVar15 = &oLastItem2;
        ppVVar11 = vPiValues_00;
        piVar24 = local_80;
        iVar10 = refineIOBySimulation
                           (local_f8,local_e8,&iLastItem2,local_b8,local_d0,local_a8,piVar15,
                            local_b0,oDep,(char *)vPiValues_00,local_80,local_c8);
        iVar8 = (int)local_88._0_4_ + 1;
        if (iVar10 != 0) {
          iVar8 = 0;
        }
        if (iVar9 == 0) {
          iVar8 = (int)local_88._0_4_ + 1;
        }
        if (((iVar9 != iVar10) || (iLastItem1 != iLastItem2)) || (oLastItem1 != oLastItem2)) {
          fwrite("Input refinement by simulation finds two circuits different.\n",0x3d,1,_stdout);
          goto LAB_00247ac7;
        }
      } while (iVar8 < 0xc9);
      puts(" done!");
      iVar8 = clock_gettime(3,(timespec *)&ts);
      oGroup1 = local_70;
      iGroup1 = local_78;
      if (iVar8 < 0) {
        lVar17 = -1;
      }
      else {
        lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      local_88 = (Abc_Ntk_t *)CONCAT44(local_88._4_4_,(float)(lVar17 + local_98) / 1e+06);
      puts("SAT-based search started ...");
      fVar23 = refineBySAT(pNtk,local_e0,iGroup1,local_a0,&iLastItem1,local_68,oGroup1,
                           in_stack_fffffffffffffe90,&oLastItem1,in_stack_fffffffffffffea0,local_f8,
                           local_e8,local_b8,local_d0,piVar15,local_a8,local_b0,ppVVar11,piVar24,
                           local_80);
      local_f8 = (Abc_Ntk_t *)CONCAT44(local_f8._4_4_,fVar23);
      printf("Init Time = %4.2f\n",(double)(float)local_90);
      printf("Simulation Time = %4.2f\n",(double)local_88._0_4_);
      printf("SAT Time = %4.2f\n",(double)local_f8._0_4_);
      printf("Overall Time = %4.2f\n",(double)(local_88._0_4_ + (float)local_90 + local_f8._0_4_));
      ppVVar18 = local_c0;
      goto LAB_00247ac7;
    }
  }
  else {
    fwrite("I/O dependencies of two circuits are different.\n",0x30,1,_stdout);
  }
  local_d8 = (Vec_Ptr_t **)0x0;
  local_c8 = (Vec_Ptr_t **)0x0;
  ppVVar18 = local_c0;
LAB_00247ac7:
  ppVVar11 = local_a8;
  if (0 < (long)iLastItem1) {
    lVar17 = 0;
    do {
      pVVar14 = local_e0[lVar17];
      if (pVVar14->pArray != (int *)0x0) {
        free(pVVar14->pArray);
        pVVar14->pArray = (int *)0x0;
      }
      if (pVVar14 != (Vec_Int_t *)0x0) {
        free(pVVar14);
      }
      pVVar14 = local_e8[lVar17];
      if (pVVar14->pArray != (int *)0x0) {
        free(pVVar14->pArray);
        pVVar14->pArray = (int *)0x0;
      }
      if (pVVar14 != (Vec_Int_t *)0x0) {
        free(pVVar14);
      }
      lVar17 = lVar17 + 1;
    } while (iLastItem1 != lVar17);
  }
  if (0 < (long)oLastItem1) {
    lVar17 = 0;
    do {
      pVVar14 = local_68[lVar17];
      if (pVVar14->pArray != (int *)0x0) {
        free(pVVar14->pArray);
        pVVar14->pArray = (int *)0x0;
      }
      if (pVVar14 != (Vec_Int_t *)0x0) {
        free(pVVar14);
      }
      pVVar14 = ppVVar11[lVar17];
      if (pVVar14->pArray != (int *)0x0) {
        free(pVVar14->pArray);
        pVVar14->pArray = (int *)0x0;
      }
      if (pVVar14 != (Vec_Int_t *)0x0) {
        free(pVVar14);
      }
      lVar17 = lVar17 + 1;
    } while (oLastItem1 != lVar17);
  }
  ppVVar11 = local_a0;
  if (0 < pNtk->vPis->nSize) {
    lVar17 = 0;
    do {
      pVVar14 = ppVVar11[lVar17];
      if (pVVar14->pArray != (int *)0x0) {
        free(pVVar14->pArray);
        pVVar14->pArray = (int *)0x0;
      }
      if (pVVar14 != (Vec_Int_t *)0x0) {
        free(pVVar14);
      }
      pVVar14 = local_d0[lVar17];
      if (pVVar14->pArray != (int *)0x0) {
        free(pVVar14->pArray);
        pVVar14->pArray = (int *)0x0;
      }
      if (pVVar14 != (Vec_Int_t *)0x0) {
        free(pVVar14);
      }
      if (local_d8 != (Vec_Ptr_t **)0x0) {
        pVVar4 = local_d8[lVar17];
        if (pVVar4->pArray != (void **)0x0) {
          free(pVVar4->pArray);
          pVVar4->pArray = (void **)0x0;
        }
        if (pVVar4 != (Vec_Ptr_t *)0x0) {
          free(pVVar4);
        }
        pVVar4 = local_c8[lVar17];
        if (pVVar4->pArray != (void **)0x0) {
          free(pVVar4->pArray);
          pVVar4->pArray = (void **)0x0;
        }
        if (pVVar4 != (Vec_Ptr_t *)0x0) {
          free(pVVar4);
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pNtk->vPis->nSize);
  }
  if (0 < pNtk->vPos->nSize) {
    lVar17 = 0;
    do {
      pVVar14 = ppVVar18[lVar17];
      if (pVVar14->pArray != (int *)0x0) {
        free(pVVar14->pArray);
        pVVar14->pArray = (int *)0x0;
      }
      if (pVVar14 != (Vec_Int_t *)0x0) {
        free(pVVar14);
      }
      pVVar14 = oDep[lVar17];
      if (pVVar14->pArray != (int *)0x0) {
        free(pVVar14->pArray);
        pVVar14->pArray = (int *)0x0;
      }
      if (pVVar14 != (Vec_Int_t *)0x0) {
        free(pVVar14);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pNtk->vPos->nSize);
  }
  if (local_e0 != (Vec_Int_t **)0x0) {
    free(local_e0);
  }
  ppVVar12 = local_68;
  piVar15 = local_70;
  if (local_e8 != (Vec_Int_t **)0x0) {
    free(local_e8);
  }
  if (ppVVar12 != (Vec_Int_t **)0x0) {
    free(ppVVar12);
  }
  if (local_a8 != (Vec_Int_t **)0x0) {
    free(local_a8);
  }
  if (ppVVar11 != (Vec_Int_t **)0x0) {
    free(ppVVar11);
  }
  if (local_d0 != (Vec_Int_t **)0x0) {
    free(local_d0);
  }
  if (ppVVar18 != (Vec_Int_t **)0x0) {
    free(ppVVar18);
  }
  if (oDep != (Vec_Int_t **)0x0) {
    free(oDep);
  }
  if (local_78 != (int *)0x0) {
    free(local_78);
  }
  if (local_b8 != (int *)0x0) {
    free(local_b8);
  }
  if (piVar15 != (int *)0x0) {
    free(piVar15);
  }
  if (local_b0 != (int *)0x0) {
    free(local_b0);
  }
  if (vPiValues != (char *)0x0) {
    free(vPiValues);
  }
  if (vPiValues_00 != (Vec_Int_t **)0x0) {
    free(vPiValues_00);
  }
  ppVVar16 = local_d8;
  if (piVar13 != (int *)0x0) {
    free(piVar13);
  }
  if (local_80 != (int *)0x0) {
    free(local_80);
  }
  if ((ppVVar16 != (Vec_Ptr_t **)0x0) && (free(ppVVar16), local_c8 != (Vec_Ptr_t **)0x0)) {
    free(local_c8);
  }
  return;
}

Assistant:

void bmGateWay( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int p_equivalence )
{	
	Vec_Int_t ** iDep1, ** oDep1;
	Vec_Int_t ** iDep2, ** oDep2;
	Vec_Int_t ** iMatch1, ** oMatch1;
	Vec_Int_t ** iMatch2, ** oMatch2;		
	int * iGroup1, * oGroup1;
	int * iGroup2, * oGroup2;
	int iLastItem1, oLastItem1;
	int iLastItem2, oLastItem2;	
	int i, j;	
	
	char * vPiValues1, * vPiValues2;
	int * observability1, * observability2;
	abctime clk = Abc_Clock();
	float initTime;
	float simulTime;
	float satTime;
	Vec_Ptr_t ** topOrder1 = NULL, ** topOrder2 = NULL;

	extern void getDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep);
	extern void initMatchList(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep, Vec_Int_t** iMatch, int* iLastItem, Vec_Int_t** oMatch, int* oLastItem, int* iGroup, int* oGroup, int p_equivalence);		
	extern void iSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, int* oGroup);
	extern void oSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, int* iGroup);
	extern int iSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** iMatch, int* iGroup, int* iLastItem, int* oGroup);
	extern int oSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, Vec_Int_t** oMatch, int* oGroup, int* oLastItem, int* iGroup);	
	extern Vec_Ptr_t ** findTopologicalOrder(Abc_Ntk_t * pNtk);
	extern int refineIOBySimulation(Abc_Ntk_t *pNtk, Vec_Int_t** iMatch, int* iLastItem, int * iGroup, Vec_Int_t** iDep, Vec_Int_t** oMatch, int* oLastItem, int * oGroup, Vec_Int_t** oDep, char * vPiValues, int * observability, Vec_Ptr_t ** topOrder);	
	extern float refineBySAT(Abc_Ntk_t * pNtk1, Vec_Int_t ** iMatch1, int * iGroup1, Vec_Int_t ** iDep1, int* iLastItem1, Vec_Int_t ** oMatch1, int * oGroup1, Vec_Int_t ** oDep1, int* oLastItem1, int * observability1,
							Abc_Ntk_t * pNtk2, Vec_Int_t ** iMatch2, int * iGroup2, Vec_Int_t ** iDep2, int* iLastItem2, Vec_Int_t ** oMatch2, int * oGroup2, Vec_Int_t ** oDep2, int* oLastItem2, int * observability2);				
	int checkListConsistency(Vec_Int_t ** iMatch1, Vec_Int_t ** oMatch1, Vec_Int_t ** iMatch2, Vec_Int_t ** oMatch2, int iLastItem1, int oLastItem1, int iLastItem2, int oLastItem2);	

	iDep1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk1) );
	oDep1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk1) );

	iDep2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk2) );
	oDep2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk2) );

	iMatch1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk1) );
	oMatch1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk1) );

	iMatch2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk2) );
	oMatch2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk2) );		

	iGroup1 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk1) );
	oGroup1 = ABC_ALLOC( int, Abc_NtkPoNum(pNtk1) );

	iGroup2 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk2) );
	oGroup2 = ABC_ALLOC( int, Abc_NtkPoNum(pNtk2) );

	vPiValues1 = ABC_ALLOC( char,  Abc_NtkPiNum(pNtk1) + 1);
	vPiValues1[Abc_NtkPiNum(pNtk1)] = '\0';	

	vPiValues2 = ABC_ALLOC( char,  Abc_NtkPiNum(pNtk2) + 1);
	vPiValues2[Abc_NtkPiNum(pNtk2)] = '\0';	

	observability1 = ABC_ALLOC(int, (unsigned)Abc_NtkPiNum(pNtk1));
	observability2 = ABC_ALLOC(int, (unsigned)Abc_NtkPiNum(pNtk2));

	for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
	{		
		iDep1[i] = Vec_IntAlloc( 1 );
		iMatch1[i] = Vec_IntAlloc( 1 );

		iDep2[i] = Vec_IntAlloc( 1 );
		iMatch2[i] = Vec_IntAlloc( 1 );

		vPiValues1[i] = '0';
		vPiValues2[i] = '0';

		observability1[i] = 0;
		observability2[i] = 0;
	}

	for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)
	{
		oDep1[i] = Vec_IntAlloc( 1 );
		oMatch1[i] = Vec_IntAlloc( 1 );

		oDep2[i] = Vec_IntAlloc( 1 );
		oMatch2[i] = Vec_IntAlloc( 1 );
	}	
	
	/************* Strashing ************/	
	pNtk1 = Abc_NtkStrash( pNtk1, 0, 0, 0 );	
	pNtk2 = Abc_NtkStrash( pNtk2, 0, 0, 0 );			
	printf("Network  strashing is done!\n");	
	/************************************/	
	
	/******* Getting Dependencies *******/	
	getDependencies(pNtk1, iDep1, oDep1);
	getDependencies(pNtk2, iDep2, oDep2);			
	printf("Getting dependencies is done!\n");	
	/************************************/

	/***** Intializing match lists ******/	
	initMatchList(pNtk1, iDep1, oDep1, iMatch1, &iLastItem1, oMatch1, &oLastItem1, iGroup1, oGroup1, p_equivalence);			
	initMatchList(pNtk2, iDep2, oDep2, iMatch2, &iLastItem2, oMatch2, &oLastItem2, iGroup2, oGroup2, p_equivalence);	
	printf("Initializing match lists is done!\n");		
	/************************************/

	if( !checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2) )
	{
		fprintf( stdout, "I/O dependencies of two circuits are different.\n");
		goto freeAndExit;
	}		

	printf("Refining IOs by dependencies ...");				
	// split match lists further by checking dependencies
	do
	{
		int iNumOfItemsAdded = 1, oNumOfItemsAdded = 1;		

		do
		{	
			if( oNumOfItemsAdded )
			{
				iSortDependencies(pNtk1, iDep1, oGroup1);
				iSortDependencies(pNtk2, iDep2, oGroup2);
			}
			
			if( iNumOfItemsAdded )
			{
				oSortDependencies(pNtk1, oDep1, iGroup1);
				oSortDependencies(pNtk2, oDep2, iGroup2);
			}

			if( iLastItem1 < Abc_NtkPiNum(pNtk1) )
			{				
				iSplitByDep(pNtk1, iDep1, iMatch1, iGroup1, &iLastItem1, oGroup1);
				if( oLastItem1 < Abc_NtkPoNum(pNtk1) )
					oSplitByDep(pNtk1, oDep1, oMatch1, oGroup1, &oLastItem1, iGroup1);
			}				

			if( iLastItem2 < Abc_NtkPiNum(pNtk2) )
				iNumOfItemsAdded = iSplitByDep(pNtk2, iDep2, iMatch2, iGroup2, &iLastItem2, oGroup2);
			else
				iNumOfItemsAdded = 0;	
				
			if( oLastItem2 < Abc_NtkPoNum(pNtk2) )		
				oNumOfItemsAdded = oSplitByDep(pNtk2, oDep2, oMatch2, oGroup2, &oLastItem2, iGroup2);
			else
				oNumOfItemsAdded = 0;
			
			if(!checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2))
			{
				fprintf( stdout, "I/O dependencies of two circuits are different.\n");
				goto freeAndExit;
			}		
		}while(iNumOfItemsAdded != 0 || oNumOfItemsAdded != 0);

	}while(0);

	printf(" done!\n");

	initTime = ((float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC));	
	clk = Abc_Clock();

	topOrder1 = findTopologicalOrder(pNtk1);
	topOrder2 = findTopologicalOrder(pNtk2);

	printf("Refining IOs by simulation ...");				

	do
	{
		int counter = 0;
		int ioSuccess1, ioSuccess2;	
		
		do
		{
			for(i = 0; i < iLastItem1; i++)
			{
				int temp = (int)(SIM_RANDOM_UNSIGNED % 2);		
				
				if(Vec_IntSize(iMatch1[i]) != Vec_IntSize(iMatch2[i]))
				{
					fprintf( stdout, "Input refinement by simulation finds two circuits different.\n");				
					goto freeAndExit;
				}
				
				for(j = 0; j < Vec_IntSize(iMatch1[i]); j++)
				{
					vPiValues1[Vec_IntEntry(iMatch1[i], j)] = temp + '0';
					vPiValues2[Vec_IntEntry(iMatch2[i], j)] = temp + '0';	
				}			
			}					
			
			ioSuccess1 = refineIOBySimulation(pNtk1, iMatch1, &iLastItem1, iGroup1, iDep1, oMatch1, &oLastItem1, oGroup1, oDep1, vPiValues1, observability1, topOrder1);				
			ioSuccess2 = refineIOBySimulation(pNtk2, iMatch2, &iLastItem2, iGroup2, iDep2, oMatch2, &oLastItem2, oGroup2, oDep2, vPiValues2, observability2, topOrder2);
			
			if(ioSuccess1 && ioSuccess2)
				counter = 0;
			else
				counter++;						
			
			if(ioSuccess1 != ioSuccess2 ||
			   !checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2))
			{
				fprintf( stdout, "Input refinement by simulation finds two circuits different.\n");				
				goto freeAndExit;
			}
		}while(counter <= 200);				
		
	}while(0);	

	printf(" done!\n");
	
	simulTime = (float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC);
	printf("SAT-based search started ...\n");

	satTime = refineBySAT(pNtk1, iMatch1, iGroup1, iDep1, &iLastItem1, oMatch1, oGroup1, oDep1, &oLastItem1, observability1,
		   					   pNtk2, iMatch2, iGroup2, iDep2, &iLastItem2, oMatch2, oGroup2, oDep2, &oLastItem2, observability2);

	printf( "Init Time = %4.2f\n", initTime );	
	printf( "Simulation Time = %4.2f\n", simulTime );
	printf( "SAT Time = %4.2f\n", satTime );
	printf( "Overall Time = %4.2f\n", initTime + simulTime + satTime );
	
freeAndExit:

	for(i = 0; i < iLastItem1 ; i++)
	{			
		
		Vec_IntFree( iMatch1[i] );
		Vec_IntFree( iMatch2[i] );
	}
	
	for(i = 0; i < oLastItem1 ; i++)
	{			
		
		Vec_IntFree( oMatch1[i] );
		Vec_IntFree( oMatch2[i] );
	}

	for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
	{
		Vec_IntFree( iDep1[i] );
		Vec_IntFree( iDep2[i] );
		if(topOrder1 != NULL) {
			Vec_PtrFree( topOrder1[i] );
			Vec_PtrFree( topOrder2[i] );
		}
	}

	for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)
	{
		Vec_IntFree( oDep1[i] );
		Vec_IntFree( oDep2[i] );
	}

	ABC_FREE( iMatch1 );
	ABC_FREE( iMatch2 );
	ABC_FREE( oMatch1 );
	ABC_FREE( oMatch2 );
	ABC_FREE( iDep1 );
	ABC_FREE( iDep2 );
	ABC_FREE( oDep1 );
	ABC_FREE( oDep2 );
	ABC_FREE( iGroup1 );
	ABC_FREE( iGroup2 );
	ABC_FREE( oGroup1 );
	ABC_FREE( oGroup2 );	
	ABC_FREE( vPiValues1 );
	ABC_FREE( vPiValues2 );
	ABC_FREE( observability1 );
	ABC_FREE( observability2 );
	if(topOrder1 != NULL) {
		ABC_FREE( topOrder1 );
		ABC_FREE( topOrder2 );
	}
}